

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall tonk::Connection::postNextTimer(Connection *this)

{
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *pbVar1;
  long lVar2;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:926:25)>
  *this_00;
  ptr local_50;
  anon_class_8_1_8991fb9c local_38;
  
  local_50.h = (anon_class_8_1_8991fb9c *)0x4c4b40;
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::expires_after((this->Ticker)._M_t.
                  super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                  .
                  super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
                  ._M_head_impl,(duration *)&local_50);
  pbVar1 = (this->Ticker)._M_t.
           super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
           .
           super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
           ._M_head_impl;
  local_50.h = &local_38;
  lVar2 = (long)(pbVar1->
                super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                ).service_;
  local_38.this = this;
  this_00 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:926:25)>
             *)asio::asio_handler_allocate(0x30,local_50.h);
  local_50.v = this_00;
  asio::detail::wait_op::wait_op
            ((wait_op *)this_00,
             asio::detail::
             wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:926:25)>
             ::do_complete);
  (this_00->handler_).this = local_38.this;
  *(bool *)((long)&(pbVar1->
                   super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                   ).implementation_ + 8) = true;
  local_50.p = this_00;
  asio::detail::epoll_reactor::
  schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
            (*(epoll_reactor **)(lVar2 + 0x58),
             (timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
              *)(lVar2 + 0x28),
             &(pbVar1->
              super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
              ).implementation_.expiry,
             (per_timer_data *)
             ((long)&(pbVar1->
                     super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                     ).implementation_ + 0x10),(wait_op *)this_00);
  local_50.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:926:25)>
                *)0x0;
  local_50.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:926:25)>
                *)0x0;
  asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:926:25)>
  ::ptr::~ptr(&local_50);
  return;
}

Assistant:

void Connection::postNextTimer()
{
    Ticker->expires_after(std::chrono::microseconds(protocol::kSendTimerTickIntervalUsec));

    Ticker->async_wait(([this](const asio::error_code& error)
    {
        // Note: Dispatch invokes on the same thread if possible.
        // It often executes immediately.
        AsioEventStrand->dispatch([this, error]() {
            if (error) {
                onTimerError(error);
            }
            else if (TimerTickResult::TickAgain == onTimerTick()) {
                postNextTimer();
            }
        });
    }));
}